

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDComponentList::CreateFromComponentList
          (ON_SubDComponentList *this,ON_SubD *subd,
          ON_SimpleArray<ON_SubDComponentPtr> *component_list)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint marked_component_count;
  ulong uVar4;
  ON_ComponentStatus *this_00;
  uint i;
  ulong uVar5;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore(&saved_marks,subd);
  uVar3 = component_list->m_count;
  marked_component_count = 0;
  for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = component_list->m_a[uVar5].m_ptr;
    uVar4 = uVar1 & 0xfffffffffffffff8;
    if (uVar4 != 0 && (uVar1 & 6) != 0) {
      this_00 = (ON_ComponentStatus *)(uVar4 + 0x10);
      bVar2 = ON_ComponentStatus::RuntimeMark(this_00);
      if (!bVar2) {
        ON_ComponentStatus::SetRuntimeMark(this_00);
        marked_component_count = marked_component_count + 1;
      }
    }
  }
  uVar3 = Internal_Create(this,subd,true,true,true,true,marked_component_count);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore(&saved_marks);
  return uVar3;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromComponentList(const ON_SubD& subd, const ON_SimpleArray<ON_SubDComponentPtr>& component_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = component_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDComponentBase* c = component_list[i].ComponentBase();
    if (nullptr == c)
      continue;
    if (c->m_status.RuntimeMark())
      continue;
    c->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, true, true, true, marked_count);
}